

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.h
# Opt level: O3

void __thiscall adios2::core::compress::CompressPNG::~CompressPNG(CompressPNG *this)

{
  ~CompressPNG(this);
  operator_delete(this);
  return;
}

Assistant:

~CompressPNG() = default;